

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.hpp
# Opt level: O2

void __thiscall
uv::Signal::start(Signal *this,function<void_(int)> *handler,int sigNum,error_code *ec)

{
  int e;
  error_code eVar1;
  
  std::function<void_(int)>::operator=(&this->startHandler_,handler);
  e = uv_signal_start(this,start::anon_class_1_0_00000001::__invoke,sigNum);
  if (e != 0) {
    eVar1 = makeErrorCode(e);
    ec->_M_value = eVar1._M_value;
    ec->_M_cat = eVar1._M_cat;
  }
  return;
}

Assistant:

inline void Signal::start(const std::function<void(int signum)> &handler, int sigNum, std::error_code &ec)
	{
		startHandler_ = handler;
		auto status = uv_signal_start(&handle_, [](uv_signal_t *handle, int num) {
			auto &signal = *reinterpret_cast<uv::Signal *>(handle->data);
			signal.startHandler_(num);
		}, sigNum);

		if (status != 0) {
			ec = makeErrorCode(status);
		}
	}